

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmRemoveFile(char *name)

{
  allocator<char> local_31;
  string local_30;
  char *local_10;
  char *name_local;
  
  local_10 = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_31);
  cmsys::SystemTools::RemoveFile(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

static void CCONV cmRemoveFile(const char* name)
{
  cmSystemTools::RemoveFile(name);
}